

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O0

void __thiscall
boost::runtime::parameter<unsigned_int,(boost::runtime::args_amount)0,false>::
parameter<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::value_hint_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<unsigned_int_const,boost::runtime::(anonymous_namespace)::optional_value_t,unsigned_int_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<unsigned_int_const,boost::runtime::(anonymous_namespace)::default_value_t,unsigned_int_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>>>
          (parameter<unsigned_int,_(boost::runtime::args_amount)0,_false> *this,cstring *name,
          named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::value_hint_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_unsigned_int,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_unsigned_int_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_unsigned_int,_boost::runtime::(anonymous_namespace)::default_value_t,_const_unsigned_int_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>_>_>
          *m)

{
  undefined1 uVar1;
  bool bVar2;
  named_parameter_combine<boost::nfp::named_parameter<const_unsigned_int,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_unsigned_int_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_unsigned_int,_boost::runtime::(anonymous_namespace)::default_value_t,_const_unsigned_int_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
  *in_RDX;
  named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::value_hint_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_unsigned_int,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_unsigned_int_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_unsigned_int,_boost::runtime::(anonymous_namespace)::default_value_t,_const_unsigned_int_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>_>_>
  *in_RSI;
  specific_param_error<boost::runtime::invalid_param_spec,_boost::runtime::init_error> *in_RDI;
  undefined6 in_stack_fffffffffffffdc0;
  basic_cstring<const_char> *this_00;
  basic_cstring<const_char> *in_stack_fffffffffffffe10;
  specific_param_error<boost::runtime::invalid_param_spec,_boost::runtime::init_error>
  *in_stack_fffffffffffffe18;
  named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::value_hint_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_unsigned_int,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_unsigned_int_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_unsigned_int,_boost::runtime::(anonymous_namespace)::default_value_t,_const_unsigned_int_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>_>_>
  *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  cstring *in_stack_ffffffffffffff98;
  basic_param *in_stack_ffffffffffffffa0;
  basic_cstring<const_char> local_28;
  named_parameter_combine<boost::nfp::named_parameter<const_unsigned_int,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_unsigned_int_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_unsigned_int,_boost::runtime::(anonymous_namespace)::default_value_t,_const_unsigned_int_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
  *local_18;
  
  this_00 = &local_28;
  local_18 = in_RDX;
  unit_test::basic_cstring<const_char>::basic_cstring(this_00,(basic_cstring<const_char> *)in_RSI);
  basic_param::
  basic_param<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::value_hint_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<unsigned_int_const,boost::runtime::(anonymous_namespace)::optional_value_t,unsigned_int_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<unsigned_int_const,boost::runtime::(anonymous_namespace)::default_value_t,unsigned_int_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(bool)in_stack_ffffffffffffff97,
             (bool)in_stack_ffffffffffffff96,in_stack_ffffffffffffff88);
  *(undefined ***)&(in_RDI->super_init_error).super_param_error = &PTR__parameter_003038b8;
  argument_factory<unsigned_int,false,false>::
  argument_factory<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::value_hint_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<unsigned_int_const,boost::runtime::(anonymous_namespace)::optional_value_t,unsigned_int_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<unsigned_int_const,boost::runtime::(anonymous_namespace)::default_value_t,unsigned_int_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>>>
            ((argument_factory<unsigned_int,_false,_false> *)this_00,in_RSI);
  uVar1 = nfp::
          named_parameter_combine<boost::nfp::named_parameter<const_unsigned_int,_boost::runtime::(anonymous_namespace)::default_value_t,_const_unsigned_int_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
          ::has(&local_18->
                 super_named_parameter_combine<boost::nfp::named_parameter<const_unsigned_int,_boost::runtime::(anonymous_namespace)::default_value_t,_const_unsigned_int_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
               );
  bVar2 = nfp::
          named_parameter_combine<boost::nfp::named_parameter<const_unsigned_int,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_unsigned_int_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_unsigned_int,_boost::runtime::(anonymous_namespace)::default_value_t,_const_unsigned_int_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
          ::has(local_18);
  if ((bVar2) && ((in_RDI[3].super_init_error.super_param_error.field_0x1 & 1) != 0)) {
    unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT17(uVar1,CONCAT16(bVar2,in_stack_fffffffffffffdc0)));
    invalid_param_spec::invalid_param_spec((invalid_param_spec *)this_00,(cstring *)in_RSI);
    specific_param_error<boost::runtime::invalid_param_spec,_boost::runtime::init_error>::operator<<
              (in_RDI,(char *)this_00);
    specific_param_error<boost::runtime::invalid_param_spec,boost::runtime::init_error>::operator<<
              (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    specific_param_error<boost::runtime::invalid_param_spec,_boost::runtime::init_error>::operator<<
              (in_RDI,(char *)this_00);
    unit_test::ut_detail::throw_exception<boost::runtime::invalid_param_spec>
              ((invalid_param_spec *)this_00);
  }
  return;
}

Assistant:

parameter( cstring name, Modifiers const& m )
#endif
    : basic_param( name, a != runtime::REQUIRED_PARAM, a == runtime::REPEATABLE_PARAM, m )
    , m_arg_factory( m )
    {
        BOOST_TEST_I_ASSRT( !m.has( default_value ) || a == runtime::OPTIONAL_PARAM,
                            invalid_param_spec() << "Parameter " << name
                                                 << " is not optional and can't have default_value." );

        BOOST_TEST_I_ASSRT( !m.has( optional_value ) || !this->p_repeatable,
                            invalid_param_spec() << "Parameter " << name
                                                 << " is repeatable and can't have optional_value." );
    }